

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char> __thiscall
fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_long>
          (detail *this,basic_appender<char> out,write_int_arg<unsigned_long> arg,
          format_specs *specs)

{
  bool bVar1;
  uint uVar2;
  make_unsigned_t<int> mVar3;
  basic_appender<char> bVar4;
  uint uVar5;
  uint uVar6;
  format_specs *specs_00;
  long lVar7;
  int value;
  char *pcVar8;
  anon_class_24_4_0fb5e8cf local_98;
  size_padding sp;
  char buffer [64];
  char local_38 [8];
  
  specs_00 = arg._8_8_;
  uVar5 = (specs_00->super_basic_specs).data_;
  if (((byte)uVar5 & 7) < 8) {
    uVar6 = (uint)arg.abs_value;
    pcVar8 = local_38;
    switch(uVar5 & 7) {
    default:
      pcVar8 = do_format_decimal<char,unsigned_long>(buffer,(unsigned_long)out.container,0x40);
      break;
    case 1:
    case 2:
      goto switchD_001b9eae_caseD_1;
    case 4:
      pcVar8 = do_format_base2e<char,unsigned_long>
                         (4,buffer,(unsigned_long)out.container,0x40,
                          (bool)((byte)(uVar5 >> 0xc) & 1));
      uVar5 = (specs_00->super_basic_specs).data_;
      if ((uVar5 >> 0xd & 1) != 0) {
        uVar2 = (uint)((uVar5 >> 0xc & 1) == 0) << 0xd | 0x5830;
        uVar5 = uVar2 << 8;
        if (uVar6 == 0) {
          uVar5 = uVar2;
        }
        uVar6 = (uVar5 | uVar6) + 0x2000000;
      }
      break;
    case 5:
      lVar7 = 0;
      bVar4.container = out.container;
      do {
        pcVar8[-1] = (byte)bVar4.container & 7 | 0x30;
        pcVar8 = pcVar8 + -1;
        lVar7 = lVar7 + 1;
        bVar1 = (buffer<char> *)0x7 < bVar4.container;
        bVar4.container = bVar4.container >> 3;
      } while (bVar1);
      if (((uVar5 >> 0xd & 1) != 0) &&
         (out.container != (buffer<char> *)0x0 && specs_00->precision <= lVar7)) {
        uVar5 = 0x3000;
        if (uVar6 == 0) {
          uVar5 = 0x30;
        }
        uVar6 = (uVar5 | uVar6) + 0x1000000;
      }
      break;
    case 6:
      do {
        pcVar8[-1] = (byte)out.container & 1 | 0x30;
        pcVar8 = pcVar8 + -1;
        bVar1 = (buffer<char> *)0x1 < out.container;
        out.container = out.container >> 1;
      } while (bVar1);
      if ((uVar5 >> 0xd & 1) != 0) {
        uVar2 = (uint)((uVar5 >> 0xc & 1) == 0) << 0xd | 0x4230;
        uVar5 = uVar2 << 8;
        if (uVar6 == 0) {
          uVar5 = uVar2;
        }
        uVar6 = (uVar5 | uVar6) + 0x2000000;
      }
      break;
    case 7:
      bVar4 = write_char<char,fmt::v11::basic_appender<char>>
                        ((basic_appender<char>)this,(char)out.container,specs_00);
      return (basic_appender<char>)bVar4.container;
    }
    value = (int)local_38 - (int)pcVar8;
    if (specs_00->precision == -1 && specs_00->width == 0) {
      mVar3 = to_unsigned<int>(value);
      bVar4 = reserve<char>((basic_appender<char>)this,(ulong)((uVar6 >> 0x18) + mVar3));
      for (uVar6 = uVar6 & 0xffffff; uVar6 != 0; uVar6 = uVar6 >> 8) {
        local_98._0_8_ = bVar4;
        basic_appender<char>::operator=((basic_appender<char> *)&local_98,(char)uVar6);
      }
      buffer<char>::append<char>(bVar4.container,pcVar8,local_38);
    }
    else {
      size_padding::size_padding(&sp,value,uVar6,specs_00);
      local_98.padding = sp.padding;
      local_98.prefix = uVar6;
      local_98.begin = pcVar8;
      local_98.end = local_38;
      bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned_long>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                        ((basic_appender<char>)this,specs_00,(ulong)sp.size,&local_98);
    }
    return (basic_appender<char>)bVar4.container;
  }
switchD_001b9eae_caseD_1:
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/format.h"
              ,0x7ee,"");
}

Assistant:

FMT_CONSTEXPR FMT_INLINE auto write_int(OutputIt out, write_int_arg<T> arg,
                                        const format_specs& specs) -> OutputIt {
  static_assert(std::is_same<T, uint32_or_64_or_128_t<T>>::value, "");

  constexpr int buffer_size = num_bits<T>();
  char buffer[buffer_size];
  if (is_constant_evaluated()) fill_n(buffer, buffer_size, '\0');
  const char* begin = nullptr;
  const char* end = buffer + buffer_size;

  auto abs_value = arg.abs_value;
  auto prefix = arg.prefix;
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    begin = do_format_decimal(buffer, abs_value, buffer_size);
    break;
  case presentation_type::hex:
    begin = do_format_base2e(4, buffer, abs_value, buffer_size, specs.upper());
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    break;
  case presentation_type::oct: {
    begin = do_format_base2e(3, buffer, abs_value, buffer_size);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    auto num_digits = end - begin;
    if (specs.alt() && specs.precision <= num_digits && abs_value != 0)
      prefix_append(prefix, '0');
    break;
  }
  case presentation_type::bin:
    begin = do_format_base2e(1, buffer, abs_value, buffer_size);
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(abs_value), specs);
  }

  // Write an integer in the format
  //   <left-padding><prefix><numeric-padding><digits><right-padding>
  // prefix contains chars in three lower bytes and the size in the fourth byte.
  int num_digits = static_cast<int>(end - begin);
  // Slightly faster check for specs.width == 0 && specs.precision == -1.
  if ((specs.width | (specs.precision + 1)) == 0) {
    auto it = reserve(out, to_unsigned(num_digits) + (prefix >> 24));
    for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
      *it++ = static_cast<Char>(p & 0xff);
    return base_iterator(out, copy<Char>(begin, end, it));
  }
  auto sp = size_padding(num_digits, prefix, specs);
  unsigned padding = sp.padding;
  return write_padded<Char, align::right>(
      out, specs, sp.size, [=](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        it = detail::fill_n(it, padding, static_cast<Char>('0'));
        return copy<Char>(begin, end, it);
      });
}